

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_strfmt(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  double n;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  int in_EAX;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  undefined8 *puVar15;
  long *plVar16;
  double *pdVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  undefined4 in_register_00000034;
  byte *pbVar22;
  undefined8 uVar23;
  char *pcVar24;
  uint uVar25;
  byte *pbVar26;
  byte *pbVar27;
  uint uVar28;
  char *end;
  char number_buffer [64];
  byte *local_80;
  char local_78 [72];
  
  pbVar22 = (byte *)CONCAT44(in_register_00000034,buf_size);
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x1be0,"int nk_strfmt(char *, int, const char *, struct __va_list_tag *)");
  }
  if (pbVar22 != (byte *)0x0) {
    if (*pbVar22 != 0) {
      uVar28 = 0;
      bVar4 = false;
      uVar13 = 0;
LAB_00134279:
      uVar10 = (ulong)(int)uVar13;
      pbVar26 = pbVar22;
      uVar12 = 0x100;
      if (0x100 < (int)uVar13) {
        uVar12 = uVar13 & 0xffffffff;
      }
      while( true ) {
        uVar13 = uVar12;
        pbVar26 = pbVar26 + 1;
        bVar1 = *pbVar22;
        if ((bVar1 == 0) || (bVar1 == 0x25)) break;
        if (0xff < (long)uVar10) goto LAB_001342b4;
        pbVar22 = pbVar22 + 1;
        buf[uVar10] = bVar1;
        uVar10 = uVar10 + 1;
        uVar12 = uVar13;
      }
      uVar13 = uVar10 & 0xffffffff;
LAB_001342b4:
      iVar9 = (int)uVar13;
      if ((bVar1 != 0) && (iVar9 < 0x100)) {
        do {
          bVar1 = *pbVar26;
          if (bVar1 < 0x2b) {
            if (bVar1 == 0x20) {
              uVar19 = 4;
              bVar5 = 0;
            }
            else {
              if (bVar1 != 0x23) goto LAB_00134315;
              uVar19 = 0;
              bVar5 = 0;
            }
          }
          else if (bVar1 == 0x30) {
            uVar19 = 0x20;
            bVar5 = 0;
          }
          else {
            uVar19 = 0;
            bVar5 = 1;
            if (bVar1 != 0x2d) {
              if (bVar1 != 0x2b) goto LAB_00134315;
              uVar19 = 2;
              bVar5 = 0;
            }
          }
          uVar28 = uVar28 | uVar19;
          bVar4 = (bool)(bVar4 | bVar5);
          pbVar26 = pbVar26 + 1;
        } while( true );
      }
      goto LAB_00134e18;
    }
    iVar9 = 0;
LAB_00134e18:
    in_EAX = 0xff;
    if (iVar9 < 0xff) {
      in_EAX = iVar9;
    }
    buf[in_EAX] = '\0';
  }
  return in_EAX;
LAB_00134315:
  if ((byte)(bVar1 - 0x31) < 9) {
    iVar7 = nk_strtoi((char *)pbVar26,(char **)&local_80);
    pbVar27 = local_80;
    if (pbVar26 == local_80) {
      iVar7 = -1;
    }
  }
  else {
    pbVar27 = pbVar26;
    iVar7 = -1;
    if (bVar1 == 0x2a) {
      uVar19 = *(uint *)fmt;
      if ((ulong)uVar19 < 0x29) {
        piVar11 = (int *)((ulong)uVar19 + *(long *)(fmt + 0x10));
        *(uint *)fmt = uVar19 + 8;
      }
      else {
        piVar11 = *(int **)(fmt + 8);
        *(int **)(fmt + 8) = piVar11 + 2;
      }
      pbVar27 = pbVar26 + 1;
      iVar7 = *piVar11;
    }
  }
  pbVar22 = pbVar27;
  iVar8 = -1;
  if (*pbVar27 == 0x2e) {
    if (pbVar27[1] == 0x2a) {
      uVar19 = *(uint *)fmt;
      if ((ulong)uVar19 < 0x29) {
        piVar11 = (int *)((ulong)uVar19 + *(long *)(fmt + 0x10));
        *(uint *)fmt = uVar19 + 8;
      }
      else {
        piVar11 = *(int **)(fmt + 8);
        *(int **)(fmt + 8) = piVar11 + 2;
      }
      pbVar22 = pbVar27 + 2;
      iVar8 = *piVar11;
    }
    else {
      iVar8 = nk_strtoi((char *)(pbVar27 + 1),(char **)&local_80);
      pbVar22 = local_80;
      if (local_80 == pbVar27 + 1) {
        iVar8 = -1;
      }
    }
  }
  if (*pbVar22 == 0x6c) {
    pbVar22 = pbVar22 + 1;
    uVar12 = 3;
  }
  else {
    uVar12 = 2;
    if (*pbVar22 == 0x68) {
      uVar12 = (ulong)(pbVar22[1] != 0x68);
      pbVar26 = pbVar22 + 1;
      if (pbVar22[1] != 0x68) {
        pbVar26 = pbVar22;
      }
      pbVar22 = pbVar26 + 1;
    }
  }
  bVar1 = *pbVar22;
  iVar20 = (int)uVar12;
  switch(bVar1) {
  case 99:
  case 100:
  case 0x69:
    iVar9 = (*(code *)(&DAT_0015b400 + *(int *)(&DAT_0015b400 + uVar12 * 4)))();
    return iVar9;
  case 0x66:
    if (iVar8 < 0) {
      iVar8 = 6;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    uVar19 = *(uint *)(fmt + 4);
    if ((ulong)uVar19 < 0xa1) {
      pdVar17 = (double *)((ulong)uVar19 + *(long *)(fmt + 0x10));
      *(uint *)(fmt + 4) = uVar19 + 0x10;
    }
    else {
      pdVar17 = *(double **)(fmt + 8);
      *(double **)(fmt + 8) = pdVar17 + 1;
    }
    if (iVar20 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x1b9b,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    n = *pdVar17;
    nk_dtoa(local_78,n);
    lVar18 = 0;
    cVar6 = local_78[0];
    while (cVar6 != '\0') {
      lVar21 = lVar18 + 1;
      lVar18 = lVar18 + 1;
      cVar6 = local_78[lVar21];
    }
    for (lVar21 = 0; (cVar6 = local_78[lVar21], cVar6 != '\0' && (cVar6 != '.'));
        lVar21 = lVar21 + 1) {
    }
    iVar20 = (int)lVar21 + 1;
    if (cVar6 != '.') {
      iVar20 = 0;
    }
    iVar14 = (int)lVar18 - iVar20;
    if (iVar8 < iVar14) {
      iVar14 = iVar8;
    }
    iVar7 = iVar7 - (iVar14 + iVar20);
    iVar20 = 0;
    if (0 < iVar7) {
      iVar20 = iVar7;
    }
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    iVar7 = iVar7 + -1;
    if ((uVar28 & 6) == 0) {
      iVar7 = iVar20;
    }
    if (((!bVar4) && (iVar20 = iVar7 + -1, bVar2 = 0 < iVar7, iVar7 = iVar20, bVar2)) &&
       (iVar9 < 0x100)) {
      uVar12 = (long)iVar9;
      do {
        buf[uVar12] = (char)(uVar28 >> 5) << 4 | 0x20;
        uVar13 = uVar12 + 1;
        iVar7 = iVar20 + -1;
        if (iVar20 < 1) break;
        bVar2 = (long)uVar12 < 0xff;
        uVar12 = uVar13;
        iVar20 = iVar7;
      } while (bVar2);
    }
    iVar9 = (int)uVar13;
    if (((((uVar28 & 2) != 0) && (0.0 <= n)) && (cVar6 = '+', iVar9 < 0x100)) ||
       ((((uVar28 & 4) != 0 && (0.0 <= n)) && (cVar6 = ' ', iVar9 < 0x100)))) {
      uVar13 = (ulong)(iVar9 + 1);
      buf[iVar9] = cVar6;
    }
    if (local_78[0] == '\0') {
      iVar9 = 0;
      bVar2 = false;
    }
    else {
      bVar2 = false;
      pcVar24 = local_78;
      iVar9 = 0;
      cVar6 = local_78[0];
      do {
        pcVar24 = pcVar24 + 1;
        iVar9 = (iVar9 + 1) - (uint)!bVar2;
        iVar20 = (int)uVar13;
        if (iVar20 < 0x100) {
          uVar13 = (ulong)(iVar20 + 1);
          buf[iVar20] = cVar6;
        }
        if (cVar6 == '.') {
          bVar2 = true;
        }
        if (iVar8 <= iVar9) break;
        cVar6 = *pcVar24;
      } while (cVar6 != '\0');
    }
    iVar20 = iVar8 - iVar9;
    if (iVar20 != 0 && iVar9 <= iVar8) {
      do {
        bVar3 = !bVar2;
        bVar2 = true;
        if (bVar3) {
          iVar9 = (int)uVar13;
          if (iVar9 < 0x100) {
            uVar13 = (ulong)(iVar9 + 1);
            buf[iVar9] = '.';
          }
          else {
            bVar2 = false;
          }
        }
        iVar9 = (int)uVar13;
        if (iVar9 < 0x100) {
          uVar13 = (ulong)(iVar9 + 1);
          buf[iVar9] = '0';
        }
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
    }
    if (((bVar4) && (0 < iVar7)) && (iVar9 = (int)uVar13, iVar9 < 0x100)) {
      uVar25 = iVar7 - 1;
      uVar19 = 0xffU - iVar9;
      if (uVar25 < 0xffU - iVar9) {
        uVar19 = uVar25;
      }
      memset(buf + iVar9,0x20,(ulong)uVar19 + 1);
      uVar13 = 0xff - (long)iVar9;
      if (uVar25 <= uVar13) {
        uVar13 = (ulong)uVar25;
      }
      uVar13 = (ulong)(iVar9 + (int)uVar13 + 1);
    }
    break;
  case 0x6e:
    uVar19 = *(uint *)fmt;
    if ((ulong)uVar19 < 0x29) {
      plVar16 = (long *)((ulong)uVar19 + *(long *)(fmt + 0x10));
      *(uint *)fmt = uVar19 + 8;
    }
    else {
      plVar16 = *(long **)(fmt + 8);
      *(long **)(fmt + 8) = plVar16 + 1;
    }
    if (iVar20 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x1b0a,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar8 != -1) {
      __assert_fail("precision == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x1b0b,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar7 != -1) {
      __assert_fail("width == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x1b0c,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if ((int *)*plVar16 != (int *)0x0) {
      *(int *)*plVar16 = iVar9;
    }
    break;
  case 0x6f:
  case 0x75:
  case 0x78:
code_r0x001344d0:
    uVar23 = 0x10;
    if (bVar1 == 0x75) {
      uVar23 = 10;
    }
    if (bVar1 == 0x6f) {
      uVar23 = 8;
    }
    pcVar24 = "0123456789ABCDEF";
    if (bVar1 == 0x78) {
      pcVar24 = "0123456789abcdef";
    }
    iVar9 = (*(code *)(&DAT_0015b3f0 + *(int *)(&DAT_0015b3f0 + uVar12 * 4)))(pcVar24,uVar23);
    return iVar9;
  case 0x73:
    uVar19 = *(uint *)fmt;
    if ((ulong)uVar19 < 0x29) {
      puVar15 = (undefined8 *)((ulong)uVar19 + *(long *)(fmt + 0x10));
      *(uint *)fmt = uVar19 + 8;
    }
    else {
      puVar15 = *(undefined8 **)(fmt + 8);
      *(undefined8 **)(fmt + 8) = puVar15 + 1;
    }
    pcVar24 = (char *)*puVar15;
    if (pcVar24 == buf) {
      __assert_fail("str != buf && \"buffer and argument are not allowed to overlap!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x1b00,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar20 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x1b01,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar8 != -1) {
      __assert_fail("precision == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x1b02,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar7 != -1) {
      __assert_fail("width == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x1b03,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (((pcVar24 != (char *)0x0) && (cVar6 = *pcVar24, cVar6 != '\0')) && (iVar9 < 0x100)) {
      lVar18 = (long)iVar9;
      do {
        pcVar24 = pcVar24 + 1;
        buf[lVar18] = cVar6;
        cVar6 = *pcVar24;
        uVar13 = (ulong)((int)uVar13 + 1);
        if (cVar6 == '\0') break;
        bVar2 = lVar18 < 0xff;
        lVar18 = lVar18 + 1;
      } while (bVar2);
    }
    break;
  default:
    if (bVar1 == 0x58) goto code_r0x001344d0;
    if (bVar1 == 0x25) {
      if (iVar20 != 2) {
        __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                      ,0x1af8,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      if (iVar8 != -1) {
        __assert_fail("precision == (-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                      ,0x1af9,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      if (iVar7 != -1) {
        __assert_fail("width == (-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                      ,0x1afa,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      uVar13 = (ulong)(iVar9 + 1);
      buf[iVar9] = '%';
      break;
    }
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    __assert_fail("0 && \"specifier is not supported!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x1bd3,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
  }
  iVar9 = (int)uVar13;
  if ((pbVar22[1] == 0) || (pbVar22 = pbVar22 + 1, 0xff < iVar9)) goto LAB_00134e18;
  goto LAB_00134279;
}

Assistant:

NK_LIB int
nk_strfmt(char *buf, int buf_size, const char *fmt, va_list args)
{
    int result = -1;
    NK_ASSERT(buf);
    NK_ASSERT(buf_size);
    if (!buf || !buf_size || !fmt) return 0;
#ifdef NK_INCLUDE_STANDARD_IO
    result = NK_VSNPRINTF(buf, (nk_size)buf_size, fmt, args);
    result = (result >= buf_size) ? -1: result;
    buf[buf_size-1] = 0;
#else
    result = nk_vsnprintf(buf, buf_size, fmt, args);
#endif
    return result;
}